

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmClientContext.cpp
# Opt level: O1

SWIZZLE_DESCRIPTOR * __thiscall
GmmLib::GmmClientContext::GetSwizzleDesc
          (GmmClientContext *this,EXTERNAL_SWIZZLE_NAME ExternalSwizzleName,
          EXTERNAL_RES_TYPE ResType,uint8_t bpe,bool isStdSwizzle)

{
  SKU_FEATURE_TABLE *pSVar1;
  
  if (ExternalSwizzleName == TILEYS) {
    pSVar1 = GmmGetSkuTable(this->pGmmLibContext);
    if (((uint)pSVar1->field_0 & 0x40) != 0 || isStdSwizzle) {
      switch(ResType) {
      case Res_2D:
        if (bpe < 0x20) {
          if (bpe == '\b') {
            return &INTEL_TILE_YS_8;
          }
          if (bpe != '\x10') {
            return (SWIZZLE_DESCRIPTOR *)0x0;
          }
          return &INTEL_TILE_YS_16;
        }
        if (bpe == ' ') {
          return &INTEL_TILE_YS_32;
        }
        if (bpe != '@') {
          if (bpe != 0x80) {
            return (SWIZZLE_DESCRIPTOR *)0x0;
          }
          return &INTEL_TILE_YS_128;
        }
        return &INTEL_TILE_YS_64;
      case Res_3D:
        if (bpe < 0x20) {
          if (bpe == '\b') {
            return &INTEL_TILE_YS_3D_8;
          }
          if (bpe != '\x10') {
            return (SWIZZLE_DESCRIPTOR *)0x0;
          }
          return &INTEL_TILE_YS_3D_16;
        }
        if (bpe == ' ') {
          return &INTEL_TILE_YS_3D_32;
        }
        if (bpe != '@') {
          if (bpe != 0x80) {
            return (SWIZZLE_DESCRIPTOR *)0x0;
          }
          return &INTEL_TILE_YS_3D_128;
        }
        return &INTEL_TILE_YS_3D_64;
      case MSAA_2X:
        if (bpe < 0x20) {
          if (bpe == '\b') {
            return &INTEL_TILE_YS_MSAA2_8;
          }
          if (bpe != '\x10') {
            return (SWIZZLE_DESCRIPTOR *)0x0;
          }
          return &INTEL_TILE_YS_MSAA2_16;
        }
        if (bpe == ' ') {
          return &INTEL_TILE_YS_MSAA2_32;
        }
        if (bpe != '@') {
          if (bpe != 0x80) {
            return (SWIZZLE_DESCRIPTOR *)0x0;
          }
          return &INTEL_TILE_YS_MSAA2_128;
        }
        return &INTEL_TILE_YS_MSAA2_64;
      case MSAA_4X:
        if (bpe < 0x20) {
          if (bpe == '\b') {
            return &INTEL_TILE_YS_MSAA4_8;
          }
          if (bpe != '\x10') {
            return (SWIZZLE_DESCRIPTOR *)0x0;
          }
          return &INTEL_TILE_YS_MSAA4_16;
        }
        if (bpe == ' ') {
          return &INTEL_TILE_YS_MSAA4_32;
        }
        if (bpe != '@') {
          if (bpe != 0x80) {
            return (SWIZZLE_DESCRIPTOR *)0x0;
          }
          return &INTEL_TILE_YS_MSAA4_128;
        }
        return &INTEL_TILE_YS_MSAA4_64;
      case MSAA_8X:
        if (bpe < 0x20) {
          if (bpe == '\b') {
            return &INTEL_TILE_YS_MSAA8_8;
          }
          if (bpe != '\x10') {
            return (SWIZZLE_DESCRIPTOR *)0x0;
          }
          return &INTEL_TILE_YS_MSAA8_16;
        }
        if (bpe == ' ') {
          return &INTEL_TILE_YS_MSAA8_32;
        }
        if (bpe != '@') {
          if (bpe != 0x80) {
            return (SWIZZLE_DESCRIPTOR *)0x0;
          }
          return &INTEL_TILE_YS_MSAA8_128;
        }
        return &INTEL_TILE_YS_MSAA8_64;
      case MSAA_16X:
        if (bpe < 0x20) {
          if (bpe == '\b') {
            return &INTEL_TILE_YS_MSAA16_8;
          }
          if (bpe != '\x10') {
            return (SWIZZLE_DESCRIPTOR *)0x0;
          }
          return &INTEL_TILE_YS_MSAA16_16;
        }
        if (bpe == ' ') {
          return &INTEL_TILE_YS_MSAA16_32;
        }
        if (bpe != '@') {
          if (bpe != 0x80) {
            return (SWIZZLE_DESCRIPTOR *)0x0;
          }
          return &INTEL_TILE_YS_MSAA16_128;
        }
        return &INTEL_TILE_YS_MSAA16_64;
      }
    }
    else {
      pSVar1 = GmmGetSkuTable(this->pGmmLibContext);
      if (((pSVar1->field_1).field_0x4 & 8) == 0) {
        switch(ResType) {
        case Res_2D:
switchD_001c5ae7_caseD_0:
          if (bpe < 0x20) {
            if (bpe == '\b') {
              return &INTEL_TILE_64_8;
            }
            if (bpe == '\x10') {
              return &INTEL_TILE_64_16;
            }
            return (SWIZZLE_DESCRIPTOR *)0x0;
          }
          if (bpe == ' ') {
            return &INTEL_TILE_64_32;
          }
          if (bpe == '@') {
            return &INTEL_TILE_64_64;
          }
          if (bpe == 0x80) {
            return &INTEL_TILE_64_128;
          }
          return (SWIZZLE_DESCRIPTOR *)0x0;
        case Res_3D:
          if (bpe < 0x20) {
            if (bpe == '\b') {
              return &INTEL_TILE_64_3D_8;
            }
            if (bpe == '\x10') {
              return &INTEL_TILE_64_3D_16;
            }
            return (SWIZZLE_DESCRIPTOR *)0x0;
          }
          if (bpe == ' ') {
            return &INTEL_TILE_64_3D_32;
          }
          if (bpe == '@') {
            return &INTEL_TILE_64_3D_64;
          }
          if (bpe == 0x80) {
            return &INTEL_TILE_64_3D_128;
          }
          return (SWIZZLE_DESCRIPTOR *)0x0;
        case MSAA_2X:
          if (bpe < 0x20) {
            if (bpe == '\b') {
              return &INTEL_TILE_64_MSAA2_8;
            }
            if (bpe == '\x10') {
              return &INTEL_TILE_64_MSAA2_16;
            }
            return (SWIZZLE_DESCRIPTOR *)0x0;
          }
          if (bpe == ' ') {
            return &INTEL_TILE_64_MSAA2_32;
          }
          if (bpe == '@') {
            return &INTEL_TILE_64_MSAA2_64;
          }
          if (bpe == 0x80) {
            return &INTEL_TILE_64_MSAA2_128;
          }
          return (SWIZZLE_DESCRIPTOR *)0x0;
        case MSAA_4X:
        case MSAA_8X:
        case MSAA_16X:
          if (bpe < 0x20) {
            if (bpe == '\b') {
              return &INTEL_TILE_64_MSAA_8;
            }
            if (bpe == '\x10') {
              return &INTEL_TILE_64_MSAA_16;
            }
            return (SWIZZLE_DESCRIPTOR *)0x0;
          }
          if (bpe == ' ') {
            return &INTEL_TILE_64_MSAA_32;
          }
          if (bpe == '@') {
            return &INTEL_TILE_64_MSAA_64;
          }
          if (bpe == 0x80) {
            return &INTEL_TILE_64_MSAA_128;
          }
          return (SWIZZLE_DESCRIPTOR *)0x0;
        }
      }
      else {
        switch(ResType) {
        case Res_2D:
          goto switchD_001c5ae7_caseD_0;
        case Res_3D:
          if (bpe < 0x20) {
            if (bpe == '\b') {
              return &INTEL_TILE_64_V2_3D_8;
            }
            if (bpe == '\x10') {
              return &INTEL_TILE_64_V2_3D_16;
            }
            return (SWIZZLE_DESCRIPTOR *)0x0;
          }
          if (bpe == ' ') {
            return &INTEL_TILE_64_V2_3D_32;
          }
          if (bpe == '@') {
            return &INTEL_TILE_64_V2_3D_64;
          }
          if (bpe == 0x80) {
            return &INTEL_TILE_64_V2_3D_128;
          }
          return (SWIZZLE_DESCRIPTOR *)0x0;
        case MSAA_2X:
          if (bpe < 0x20) {
            if (bpe == '\b') {
              return &INTEL_TILE_64_V2_MSAA2_8;
            }
            if (bpe == '\x10') {
              return &INTEL_TILE_64_V2_MSAA2_16;
            }
            return (SWIZZLE_DESCRIPTOR *)0x0;
          }
          if (bpe == ' ') {
            return &INTEL_TILE_64_V2_MSAA2_32;
          }
          if (bpe == '@') {
            return &INTEL_TILE_64_V2_MSAA2_64;
          }
          if (bpe == 0x80) {
            return &INTEL_TILE_64_V2_MSAA2_128;
          }
          return (SWIZZLE_DESCRIPTOR *)0x0;
        case MSAA_4X:
          if (bpe < 0x20) {
            if (bpe == '\b') {
              return &INTEL_TILE_64_V2_MSAA4_8;
            }
            if (bpe == '\x10') {
              return &INTEL_TILE_64_V2_MSAA4_16;
            }
            return (SWIZZLE_DESCRIPTOR *)0x0;
          }
          if (bpe == ' ') {
            return &INTEL_TILE_64_V2_MSAA4_32;
          }
          if (bpe == '@') {
            return &INTEL_TILE_64_V2_MSAA4_64;
          }
          if (bpe == 0x80) {
            return &INTEL_TILE_64_V2_MSAA4_128;
          }
          return (SWIZZLE_DESCRIPTOR *)0x0;
        case MSAA_8X:
          if (bpe < 0x20) {
            if (bpe == '\b') {
              return &INTEL_TILE_64_V2_MSAA8_8;
            }
            if (bpe == '\x10') {
              return &INTEL_TILE_64_V2_MSAA8_16;
            }
            return (SWIZZLE_DESCRIPTOR *)0x0;
          }
          if (bpe == ' ') {
            return &INTEL_TILE_64_V2_MSAA8_32;
          }
          if (bpe == '@') {
            return &INTEL_TILE_64_V2_MSAA8_64;
          }
          if (bpe == 0x80) {
            return &INTEL_TILE_64_V2_MSAA8_128;
          }
          return (SWIZZLE_DESCRIPTOR *)0x0;
        case MSAA_16X:
          if (bpe < 0x20) {
            if (bpe == '\b') {
              return &INTEL_TILE_64_V2_MSAA16_8;
            }
            if (bpe == '\x10') {
              return &INTEL_TILE_64_V2_MSAA16_16;
            }
            return (SWIZZLE_DESCRIPTOR *)0x0;
          }
          if (bpe == ' ') {
            return &INTEL_TILE_64_V2_MSAA16_32;
          }
          if (bpe == '@') {
            return &INTEL_TILE_64_V2_MSAA16_64;
          }
          if (bpe == 0x80) {
            return &INTEL_TILE_64_V2_MSAA16_128;
          }
          return (SWIZZLE_DESCRIPTOR *)0x0;
        }
      }
    }
  }
  else {
    if (ExternalSwizzleName == TILEY) {
      pSVar1 = GmmGetSkuTable(this->pGmmLibContext);
      if (((uint)pSVar1->field_0 & 0x40) != 0) {
        return &INTEL_TILE_Y;
      }
      return &INTEL_TILE_4;
    }
    if (ExternalSwizzleName == TILEX) {
      return &INTEL_TILE_X;
    }
  }
  return (SWIZZLE_DESCRIPTOR *)0x0;
}

Assistant:

const SWIZZLE_DESCRIPTOR *GMM_STDCALL GmmLib::GmmClientContext::GetSwizzleDesc(EXTERNAL_SWIZZLE_NAME ExternalSwizzleName, EXTERNAL_RES_TYPE ResType, uint8_t bpe, bool isStdSwizzle)
{
    const SWIZZLE_DESCRIPTOR *pSwizzleDesc;
    pSwizzleDesc = NULL;
    /*#define SWITCH_SWIZZLE(Layout, res, bpe) \
        pSwizzleDesc = &Layout##_##res##bpe;*/

#define CASE_BPP(Layout, Tile, msaa, xD, bpe)       \
    case bpe:                                       \
        pSwizzleDesc = &Layout##_##Tile##msaa##bpe; \
        break;

#define SWITCH_SWIZZLE(Layout, Tile, msaa, bpe) \
    switch (bpe)                                \
    {                                           \
        CASE_BPP(Layout, Tile, msaa, xD, 8);    \
        CASE_BPP(Layout, Tile, msaa, xD, 16);   \
        CASE_BPP(Layout, Tile, msaa, xD, 32);   \
        CASE_BPP(Layout, Tile, msaa, xD, 64);   \
        CASE_BPP(Layout, Tile, msaa, xD, 128);  \
    }
#define SWIZZLE_DESC(pGmmLibContext, ExternalSwizzleName, ResType, bpe, pSwizzleDesc) \
    switch (ExternalSwizzleName)                                                      \
    {                                                                                 \
    case TILEX:                                                                       \
        pSwizzleDesc = &INTEL_TILE_X;                                                 \
        break;                                                                        \
    case TILEY:                                                                       \
        if (GmmGetSkuTable(pGmmLibContext)->FtrTileY)                                 \
            pSwizzleDesc = &INTEL_TILE_Y;                                             \
        else                                                                          \
            pSwizzleDesc = &INTEL_TILE_4;                                             \
        break;                                                                        \
    case TILEYS:                                                                      \
        if (GmmGetSkuTable(pGmmLibContext)->FtrTileY || isStdSwizzle)                 \
        {                                                                             \
            switch (ResType)                                                          \
            {                                                                         \
            case 0:                                                                   \
                SWITCH_SWIZZLE(INTEL_TILE_YS, , , bpe);                               \
                break;                                                                \
            case 1:                                                                   \
                SWITCH_SWIZZLE(INTEL_TILE_YS, 3D_, , bpe);                            \
                break;                                                                \
            case 2:                                                                   \
                SWITCH_SWIZZLE(INTEL_TILE_YS, , MSAA2_, bpe);                         \
                break;                                                                \
            case 3:                                                                   \
                SWITCH_SWIZZLE(INTEL_TILE_YS, , MSAA4_, bpe);                         \
                break;                                                                \
            case 4:                                                                   \
                SWITCH_SWIZZLE(INTEL_TILE_YS, , MSAA8_, bpe);                         \
                break;                                                                \
            case 5:                                                                   \
                SWITCH_SWIZZLE(INTEL_TILE_YS, , MSAA16_, bpe);                        \
                break;                                                                \
            }                                                                         \
        }                                                                             \
        else if (GmmGetSkuTable(pGmmLibContext)->FtrXe2PlusTiling)                    \
        {                                                                             \
            switch (ResType)                                                          \
            {                                                                         \
            case 0:                                                                   \
                SWITCH_SWIZZLE(INTEL_TILE_64, , , bpe);                               \
                break;                                                                \
            case 1:                                                                   \
                SWITCH_SWIZZLE(INTEL_TILE_64_V2, 3D_, , bpe);                         \
                break;                                                                \
            case 2:                                                                   \
                SWITCH_SWIZZLE(INTEL_TILE_64_V2, , MSAA2_, bpe);                      \
                break;                                                                \
            case 3:                                                                   \
                SWITCH_SWIZZLE(INTEL_TILE_64_V2, , MSAA4_, bpe);                      \
                break;                                                                \
            case 4:                                                                   \
                SWITCH_SWIZZLE(INTEL_TILE_64_V2, , MSAA8_, bpe);                      \
                break;                                                                \
            case 5:                                                                   \
                SWITCH_SWIZZLE(INTEL_TILE_64_V2, , MSAA16_, bpe);                     \
                break;                                                                \
            }                                                                         \
        }                                                                             \
        else                                                                          \
        {                                                                             \
            switch (ResType)                                                          \
            {                                                                         \
            case 0:                                                                   \
                SWITCH_SWIZZLE(INTEL_TILE_64, , , bpe);                               \
                break;                                                                \
            case 1:                                                                   \
                SWITCH_SWIZZLE(INTEL_TILE_64, 3D_, , bpe);                            \
                break;                                                                \
            case 2:                                                                   \
                SWITCH_SWIZZLE(INTEL_TILE_64, , MSAA2_, bpe);                         \
                break;                                                                \
            case 3:                                                                   \
            case 4:                                                                   \
            case 5:                                                                   \
                SWITCH_SWIZZLE(INTEL_TILE_64, , MSAA_, bpe);                          \
                break;                                                                \
            }                                                                         \
        }                                                                             \
    case TILEW:                                                                       \
    case TILEYF:                                                                      \
    default: break;                                                                   \
    }                                                                                 \

    SWIZZLE_DESC(pGmmLibContext, ExternalSwizzleName, ResType, bpe, pSwizzleDesc);
    return pSwizzleDesc;
}